

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O3

CodeLocation __thiscall
soul::SourceCodeUtilities::findStartOfPrecedingComment
          (SourceCodeUtilities *this,CodeLocation *location)

{
  SourceCodeUtilities *this_00;
  byte bVar1;
  SourceCodeText *pSVar2;
  bool bVar3;
  char *pcVar4;
  UnicodeChar UVar5;
  _Alloc_hider _Var6;
  ulong uVar7;
  ulong *puVar8;
  long lVar9;
  UTF8Reader extraout_RDX;
  UTF8Reader UVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  Ptr o;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  bool bVar13;
  bool bVar14;
  CodeLocation CVar15;
  CodeLocation prevLineStart;
  CodeLocation next;
  string prevLine;
  UTF8Reader temp;
  UTF8Reader local_128;
  ulong local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  CodeLocation local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  ulong local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  byte *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  ulong local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  string local_b0;
  CodeLocation local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  ulong local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  string local_60;
  CodeLocation *local_40;
  UTF8Reader local_38;
  
  CodeLocation::getStartOfPreviousLine(&local_108);
  if ((local_108.sourceCode.object == (SourceCodeText *)0x0) ||
     (((local_108.sourceCode.object)->content)._M_string_length == 0)) {
    pSVar2 = (location->sourceCode).object;
    pcVar4 = (location->location).data;
    (location->sourceCode).object = (SourceCodeText *)0x0;
    *(SourceCodeText **)this = pSVar2;
    *(char **)(this + 8) = pcVar4;
    goto LAB_001cdab6;
  }
  CodeLocation::getSourceLine_abi_cxx11_(&local_60,&local_108);
  local_80 = &local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,local_60._M_dataplus._M_p,
             local_60._M_dataplus._M_p + local_60._M_string_length);
  if (local_78 == 0) {
LAB_001cd4ef:
    local_128.data = (char *)&local_118;
    local_120 = 0;
    local_118._M_allocated_capacity = local_118._M_allocated_capacity & 0xffffffffffffff00;
    bVar14 = false;
  }
  else {
    if (((byte)local_80->_M_local_buf[0] - 9 < 5) || (local_80->_M_local_buf[0] == 0x20)) {
      if (local_78 != 1) {
        lVar9 = local_78 - 1;
        paVar11 = local_80;
        do {
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar11->_M_local_buf + 1);
          if ((4 < (byte)paVar11->_M_local_buf[0] - 9) && (paVar11->_M_local_buf[0] != 0x20)) {
            local_128.data = (char *)&local_118;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      ((string *)&local_128,paVar11,local_80->_M_local_buf + local_78);
            goto LAB_001cdaf8;
          }
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      goto LAB_001cd4ef;
    }
    local_128.data = (char *)local_80;
    if (local_80 == &local_70) {
      local_118._8_8_ = local_70._8_8_;
      local_128.data = (char *)&local_118;
    }
    local_118._M_allocated_capacity._1_7_ = local_70._M_allocated_capacity._1_7_;
    local_118._M_local_buf[0] = local_70._M_local_buf[0];
    local_120 = local_78;
    local_80 = &local_70;
    local_78 = 0;
    local_70._M_local_buf[0] = '\0';
LAB_001cdaf8:
    if (local_120 < 2) {
      bVar14 = false;
    }
    else {
      bVar14 = *(short *)local_128.data == 0x2f2f;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.data != &local_118) {
      operator_delete(local_128.data,local_118._M_allocated_capacity + 1);
    }
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(local_70._M_allocated_capacity._1_7_,local_70._M_local_buf[0])
                             + 1);
  }
  if (bVar14) {
    *(SourceCodeText **)this = local_108.sourceCode.object;
    if (local_108.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_108.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_108.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    *(char **)(this + 8) = local_108.location.data;
    paVar11 = &local_b0.field_2;
    bVar14 = false;
    do {
      CodeLocation::getStartOfPreviousLine(&local_90);
      bVar3 = true;
      if (local_90.sourceCode.object == (SourceCodeText *)0x0) {
        o.object = (SourceCodeText *)0x0;
LAB_001cd606:
        bVar14 = true;
      }
      else {
        o.object = local_90.sourceCode.object;
        if (((local_90.sourceCode.object)->content)._M_string_length == 0) goto LAB_001cd606;
        CodeLocation::getSourceLine_abi_cxx11_(&local_b0,&local_90);
        if (local_b0._M_string_length == 0) {
LAB_001cd5bb:
          local_128.data = (char *)&local_118;
          local_120 = 0;
          local_118._M_allocated_capacity = local_118._M_allocated_capacity & 0xffffffffffffff00;
          bVar13 = true;
        }
        else {
          if (((byte)*local_b0._M_dataplus._M_p - 9 < 5) || (*local_b0._M_dataplus._M_p == 0x20)) {
            if (local_b0._M_string_length != 1) {
              lVar9 = local_b0._M_string_length - 1;
              _Var6._M_p = local_b0._M_dataplus._M_p;
              do {
                _Var6._M_p = _Var6._M_p + 1;
                if ((4 < (byte)*_Var6._M_p - 9) && (*_Var6._M_p != 0x20)) {
                  local_128.data = (char *)&local_118;
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                            ((string *)&local_128,_Var6._M_p,
                             local_b0._M_dataplus._M_p + local_b0._M_string_length);
                  goto LAB_001cd6e6;
                }
                lVar9 = lVar9 + -1;
              } while (lVar9 != 0);
            }
            goto LAB_001cd5bb;
          }
          local_128.data = (char *)&local_118;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p == paVar11) {
            local_118._M_allocated_capacity =
                 CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                          local_b0.field_2._M_local_buf[0]);
            local_118._8_8_ = local_b0.field_2._8_8_;
          }
          else {
            local_118._M_allocated_capacity =
                 CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                          local_b0.field_2._M_local_buf[0]);
            local_128.data = local_b0._M_dataplus._M_p;
          }
          local_120 = local_b0._M_string_length;
          local_b0._M_dataplus._M_p = (pointer)paVar11;
          local_b0._M_string_length = 0;
          local_b0.field_2._M_local_buf[0] = '\0';
LAB_001cd6e6:
          bVar13 = true;
          if (1 < local_120) {
            bVar13 = *(short *)local_128.data != 0x2f2f;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128.data != &local_118) {
            operator_delete(local_128.data,local_118._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar11) {
          operator_delete(local_b0._M_dataplus._M_p,
                          CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                   local_b0.field_2._M_local_buf[0]) + 1);
        }
        if (bVar13) {
          bVar14 = true;
          o.object = local_90.sourceCode.object;
        }
        else {
          if (local_90.sourceCode.object != (SourceCodeText *)0x0) {
            ((local_90.sourceCode.object)->super_RefCountedObject).refCount =
                 ((local_90.sourceCode.object)->super_RefCountedObject).refCount + 1;
          }
          pSVar2 = *(SourceCodeText **)this;
          *(SourceCodeText **)this = local_90.sourceCode.object;
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar2);
          *(char **)(this + 8) = local_90.location.data;
          bVar3 = false;
          o.object = local_90.sourceCode.object;
        }
      }
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o.object);
    } while (!bVar3);
    if (!bVar14) {
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(*(SourceCodeText **)this);
    }
  }
  else {
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_60._M_dataplus._M_p,
               local_60._M_dataplus._M_p + local_60._M_string_length);
    if (local_c8 != 0) {
      puVar8 = &local_c8;
      uVar7 = local_c8;
      do {
        if ((4 < (byte)local_d0->_M_local_buf[uVar7 - 1] - 9) &&
           (local_d0->_M_local_buf[uVar7 - 1] != 0x20)) {
          local_c8 = uVar7;
          local_d0->_M_local_buf[uVar7] = 0;
          local_128.data = (char *)&local_118;
          if (local_d0 == &local_c0) {
            local_118._M_allocated_capacity = local_c0._M_allocated_capacity;
            local_118._8_8_ = local_c0._8_8_;
          }
          else {
            local_118._M_allocated_capacity = local_c0._M_allocated_capacity;
            local_128.data = (char *)local_d0;
          }
          local_118._M_allocated_capacity = local_c0._M_allocated_capacity;
          local_d0 = &local_c0;
          paVar11 = &local_c0;
          local_120 = uVar7;
          goto LAB_001cd7df;
        }
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    local_128.data = (char *)&local_118;
    puVar8 = &local_120;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128.data;
LAB_001cd7df:
    paVar12 = local_d0;
    *puVar8 = 0;
    paVar11->_M_local_buf[0] = 0;
    if (local_120 < 2) {
      bVar14 = false;
    }
    else {
      bVar14 = *(short *)(local_128.data + (local_120 - 2)) == 0x2f2a;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.data != &local_118) {
      operator_delete(local_128.data,local_118._M_allocated_capacity + 1);
      paVar12 = local_d0;
    }
    if (paVar12 != &local_c0) {
      operator_delete(paVar12,local_c0._M_allocated_capacity + 1);
    }
    if (bVar14) {
      if (local_108.sourceCode.object == (SourceCodeText *)0x0) {
        throwInternalCompilerError("object != nullptr","operator->",0x47);
      }
      local_d8 = (byte *)((local_108.sourceCode.object)->utf8).data;
      *(SourceCodeText **)this = local_108.sourceCode.object;
      ((local_108.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_108.sourceCode.object)->super_RefCountedObject).refCount + 1;
      *(char **)(this + 8) = local_108.location.data;
      local_f8 = &local_e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_60._M_dataplus._M_p,
                 local_60._M_dataplus._M_p + local_60._M_string_length);
      this_00 = this + 8;
      local_128.data = (char *)&local_118;
      if (local_f0 != 0) {
        puVar8 = &local_f0;
        uVar7 = local_f0;
        do {
          if ((4 < (byte)local_f8->_M_local_buf[uVar7 - 1] - 9) &&
             (local_f8->_M_local_buf[uVar7 - 1] != 0x20)) {
            local_f8->_M_local_buf[uVar7] = 0;
            if (local_f8 == &local_e8) {
              local_118._8_8_ = local_e8._8_8_;
            }
            else {
              local_128.data = (char *)local_f8;
            }
            local_118._M_allocated_capacity = local_e8._M_allocated_capacity;
            paVar11 = &local_e8;
            local_120 = uVar7;
            local_f8 = &local_e8;
            local_f0 = uVar7;
            goto LAB_001cd938;
          }
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      puVar8 = &local_120;
      paVar11 = &local_118;
LAB_001cd938:
      *puVar8 = 0;
      paVar11->_M_local_buf[0] = 0;
      UTF8Reader::operator+=((UTF8Reader *)this_00,(int)local_120 + -2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.data != &local_118) {
        operator_delete(local_128.data,local_118._M_allocated_capacity + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8._M_allocated_capacity + 1);
      }
      local_38.data = (char *)local_d8;
      UTF8Reader::operator++(&local_38);
      UVar10.data = *(char **)this_00;
      if (local_38.data < UVar10.data) {
        *(char **)this_00 = UVar10.data + -1;
        *(char **)this_00 = UVar10.data + -2;
        local_40 = location;
        UVar10.data = UVar10.data + -2;
        while( true ) {
          lVar9 = 0;
          local_128.data = UVar10.data;
          do {
            if (lVar9 == 2) goto LAB_001cda90;
            bVar1 = "/*"[lVar9];
            lVar9 = lVar9 + 1;
            UVar5 = UTF8Reader::getAndAdvance(&local_128);
          } while (UVar5 == bVar1);
          location = local_40;
          if (UVar10.data <= local_d8) break;
          *(char **)this_00 = UVar10.data + -1;
          UVar10.data = UVar10.data + -1;
        }
      }
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(*(SourceCodeText **)this);
    }
    pSVar2 = (location->sourceCode).object;
    pcVar4 = (location->location).data;
    (location->sourceCode).object = (SourceCodeText *)0x0;
    *(SourceCodeText **)this = pSVar2;
    *(char **)(this + 8) = pcVar4;
  }
LAB_001cda90:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
LAB_001cdab6:
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_108.sourceCode.object);
  CVar15.location.data = extraout_RDX.data;
  CVar15.sourceCode.object = (SourceCodeText *)this;
  return CVar15;
}

Assistant:

CodeLocation SourceCodeUtilities::findStartOfPrecedingComment (CodeLocation location)
{
    auto prevLineStart = location.getStartOfPreviousLine();

    if (prevLineStart.isEmpty())
        return location;

    auto prevLine = prevLineStart.getSourceLine();

    if (choc::text::startsWith (choc::text::trimStart (prevLine), "//"))
    {
        for (auto start = prevLineStart;;)
        {
            auto next = start.getStartOfPreviousLine();

            if (next.isEmpty() || ! choc::text::startsWith (choc::text::trimStart (next.getSourceLine()), "//"))
                return start;

            start = next;
        }
    }

    if (choc::text::endsWith (choc::text::trimEnd (prevLine), "*/"))
    {
        auto fileStart = prevLineStart.sourceCode->utf8;
        auto start = prevLineStart;
        start.location += static_cast<int> (choc::text::trimEnd (prevLine).length() - 2);

        if (start.location > fileStart + 1)
        {
            --(start.location);
            --(start.location);

            for (;;)
            {
                if (start.location.startsWith ("/*"))
                    return start;

                if (start.location > fileStart)
                    --(start.location);
                else
                    break;
            }
        }
    }

    return location;
}